

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_get_params
              (mbedtls_ecdh_context *ctx,mbedtls_ecp_keypair *key,mbedtls_ecdh_side side)

{
  int local_28;
  int ret;
  mbedtls_ecdh_side side_local;
  mbedtls_ecp_keypair *key_local;
  mbedtls_ecdh_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_ecp_group_copy(&ctx->grp,&key->grp);
  if (ctx_local._4_4_ == 0) {
    if (side == MBEDTLS_ECDH_THEIRS) {
      ctx_local._4_4_ = mbedtls_ecp_copy(&ctx->Qp,&key->Q);
    }
    else if (side == MBEDTLS_ECDH_OURS) {
      local_28 = mbedtls_ecp_copy(&ctx->Q,&key->Q);
      if ((local_28 == 0) && (local_28 = mbedtls_mpi_copy(&ctx->d,&key->d), local_28 == 0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = local_28;
      }
    }
    else {
      ctx_local._4_4_ = -0x4f80;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdh_get_params( mbedtls_ecdh_context *ctx, const mbedtls_ecp_keypair *key,
                     mbedtls_ecdh_side side )
{
    int ret;

    if( ( ret = mbedtls_ecp_group_copy( &ctx->grp, &key->grp ) ) != 0 )
        return( ret );

    /* If it's not our key, just import the public part as Qp */
    if( side == MBEDTLS_ECDH_THEIRS )
        return( mbedtls_ecp_copy( &ctx->Qp, &key->Q ) );

    /* Our key: import public (as Q) and private parts */
    if( side != MBEDTLS_ECDH_OURS )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_copy( &ctx->Q, &key->Q ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &ctx->d, &key->d ) ) != 0 )
        return( ret );

    return( 0 );
}